

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleCacheMode(cmSetPropertyCommand *this)

{
  bool bVar1;
  cmMakefile *this_00;
  cmake *this_01;
  cmState *this_02;
  reference pbVar2;
  char *pcVar3;
  ostream *poVar4;
  string local_6b0;
  ostringstream local_690 [8];
  ostringstream e_3;
  char *existingValue;
  cmake *cm;
  cmMakefile *mf;
  _Self local_4f8;
  const_iterator ni;
  ostringstream local_4d0 [8];
  ostringstream e_2;
  string local_358;
  ostringstream local_338 [8];
  ostringstream e_1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream e;
  cmSetPropertyCommand *this_local;
  
  bVar1 = std::operator==(&this->PropertyName,"ADVANCED");
  if (bVar1) {
    if ((this->Remove & 1U) == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmSystemTools::IsOn(pcVar3);
      if (!bVar1) {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmSystemTools::IsOff(pcVar3);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream(local_190);
          poVar4 = std::operator<<((ostream *)local_190,"given non-boolean value \"");
          poVar4 = std::operator<<(poVar4,(string *)&this->PropertyValue);
          std::operator<<(poVar4,"\" for CACHE property \"ADVANCED\".  ");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::ostringstream::~ostringstream(local_190);
          return false;
        }
      }
    }
  }
  else {
    bVar1 = std::operator==(&this->PropertyName,"TYPE");
    if (bVar1) {
      bVar1 = cmState::IsCacheEntryType(&this->PropertyValue);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_338);
        poVar4 = std::operator<<((ostream *)local_338,"given invalid CACHE entry TYPE \"");
        poVar4 = std::operator<<(poVar4,(string *)&this->PropertyValue);
        std::operator<<(poVar4,"\"");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::ostringstream::~ostringstream(local_338);
        return false;
      }
    }
    else {
      bVar1 = std::operator!=(&this->PropertyName,"HELPSTRING");
      if (((bVar1) && (bVar1 = std::operator!=(&this->PropertyName,"STRINGS"), bVar1)) &&
         (bVar1 = std::operator!=(&this->PropertyName,"VALUE"), bVar1)) {
        std::__cxx11::ostringstream::ostringstream(local_4d0);
        poVar4 = std::operator<<((ostream *)local_4d0,"given invalid CACHE property ");
        poVar4 = std::operator<<(poVar4,(string *)&this->PropertyName);
        poVar4 = std::operator<<(poVar4,".  ");
        poVar4 = std::operator<<(poVar4,"Settable CACHE properties are: ");
        std::operator<<(poVar4,"ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&ni);
        std::__cxx11::string::~string((string *)&ni);
        std::__cxx11::ostringstream::~ostringstream(local_4d0);
        return false;
      }
    }
  }
  local_4f8._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Names);
  while( true ) {
    mf = (cmMakefile *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Names);
    bVar1 = std::operator!=(&local_4f8,(_Self *)&mf);
    if (!bVar1) {
      return true;
    }
    this_00 = cmCommand::GetMakefile(&this->super_cmCommand);
    this_01 = cmMakefile::GetCMakeInstance(this_00);
    this_02 = cmake::GetState(this_01);
    pbVar2 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_4f8);
    pcVar3 = cmState::GetCacheEntryValue(this_02,pbVar2);
    if (pcVar3 == (char *)0x0) break;
    pbVar2 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_4f8);
    bVar1 = HandleCacheEntry(this,pbVar2);
    if (!bVar1) {
      return false;
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_4f8);
  }
  std::__cxx11::ostringstream::ostringstream(local_690);
  poVar4 = std::operator<<((ostream *)local_690,"could not find CACHE variable ");
  pbVar2 = std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_4f8);
  poVar4 = std::operator<<(poVar4,(string *)pbVar2);
  std::operator<<(poVar4,".  Perhaps it has not yet been created.");
  std::__cxx11::ostringstream::str();
  cmCommand::SetError(&this->super_cmCommand,&local_6b0);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::ostringstream::~ostringstream(local_690);
  return false;
}

Assistant:

bool cmSetPropertyCommand::HandleCacheMode()
{
  if (this->PropertyName == "ADVANCED") {
    if (!this->Remove && !cmSystemTools::IsOn(this->PropertyValue.c_str()) &&
        !cmSystemTools::IsOff(this->PropertyValue.c_str())) {
      std::ostringstream e;
      e << "given non-boolean value \"" << this->PropertyValue
        << "\" for CACHE property \"ADVANCED\".  ";
      this->SetError(e.str());
      return false;
    }
  } else if (this->PropertyName == "TYPE") {
    if (!cmState::IsCacheEntryType(this->PropertyValue)) {
      std::ostringstream e;
      e << "given invalid CACHE entry TYPE \"" << this->PropertyValue << "\"";
      this->SetError(e.str());
      return false;
    }
  } else if (this->PropertyName != "HELPSTRING" &&
             this->PropertyName != "STRINGS" &&
             this->PropertyName != "VALUE") {
    std::ostringstream e;
    e << "given invalid CACHE property " << this->PropertyName << ".  "
      << "Settable CACHE properties are: "
      << "ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.";
    this->SetError(e.str());
    return false;
  }

  for (std::set<std::string>::const_iterator ni = this->Names.begin();
       ni != this->Names.end(); ++ni) {
    // Get the source file.
    cmMakefile* mf = this->GetMakefile();
    cmake* cm = mf->GetCMakeInstance();
    const char* existingValue = cm->GetState()->GetCacheEntryValue(*ni);
    if (existingValue) {
      if (!this->HandleCacheEntry(*ni)) {
        return false;
      }
    } else {
      std::ostringstream e;
      e << "could not find CACHE variable " << *ni
        << ".  Perhaps it has not yet been created.";
      this->SetError(e.str());
      return false;
    }
  }
  return true;
}